

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateIfElse(ExpressionTranslateContext *ctx,ExprIfElse *expression)

{
  ExprIfElse *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  Print(ctx,"if(");
  Translate(ctx,expression->condition);
  Print(ctx,")");
  PrintLine(ctx);
  PrintIndentedLine(ctx,"{");
  ctx->depth = ctx->depth + 1;
  PrintIndent(ctx);
  Translate(ctx,expression->trueBlock);
  Print(ctx,";");
  PrintLine(ctx);
  ctx->depth = ctx->depth - 1;
  PrintIndentedLine(ctx,"}");
  if (expression->falseBlock != (ExprBase *)0x0) {
    PrintIndentedLine(ctx,"else");
    PrintIndentedLine(ctx,"{");
    ctx->depth = ctx->depth + 1;
    PrintIndent(ctx);
    Translate(ctx,expression->falseBlock);
    Print(ctx,";");
    PrintLine(ctx);
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"}");
  }
  return;
}

Assistant:

void TranslateIfElse(ExpressionTranslateContext &ctx, ExprIfElse *expression)
{
	Print(ctx, "if(");
	Translate(ctx, expression->condition);
	Print(ctx, ")");
	PrintLine(ctx);

	PrintIndentedLine(ctx, "{");
	ctx.depth++;
	PrintIndent(ctx);

	Translate(ctx, expression->trueBlock);
	
	Print(ctx, ";");

	PrintLine(ctx);
	ctx.depth--;
	PrintIndentedLine(ctx, "}");

	if(expression->falseBlock)
	{
		PrintIndentedLine(ctx, "else");

		PrintIndentedLine(ctx, "{");
		ctx.depth++;
		PrintIndent(ctx);

		Translate(ctx, expression->falseBlock);

		Print(ctx, ";");

		PrintLine(ctx);
		ctx.depth--;
		PrintIndentedLine(ctx, "}");
	}
}